

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O2

int Gia_ManFaultDumpNewFaults
              (Gia_Man_t *pM,int nFuncVars,Vec_Int_t *vTests,Vec_Int_t *vTestNew,Bmc_ParFf_t *pPars)

{
  int iVar1;
  int Entry;
  uint uVar2;
  Gia_Man_t *p;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  abctime aVar3;
  Vec_Int_t *p_00;
  abctime aVar4;
  abctime time;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int i;
  bool bVar9;
  
  p = Gia_ManFaultCofactor(pM,vTestNew);
  pCnf = Cnf_DeriveGiaRemapped(p);
  s = sat_solver_new();
  sat_solver_setnvars(s,1);
  iVar5 = pPars->nTimeOut;
  if ((long)iVar5 == 0) {
    aVar3 = 0;
  }
  else {
    aVar3 = Abc_Clock();
    aVar3 = aVar3 + (long)iVar5 * 1000000;
  }
  s->nRuntimeLimit = aVar3;
  iVar8 = 0;
  Gia_ManFaultAddOne(pM,(Cnf_Dat_t *)0x0,s,vTestNew,nFuncVars,1,(Gia_Man_t *)0x0);
  iVar5 = vTests->nSize / nFuncVars;
  if (vTests->nSize % nFuncVars == 0) {
    p_00 = Vec_IntAlloc(nFuncVars);
    iVar1 = 0;
    if (0 < nFuncVars) {
      iVar1 = nFuncVars;
    }
    if (iVar5 < 1) {
      iVar5 = 0;
    }
    iVar7 = 0;
    do {
      if (iVar7 == iVar5) {
        Vec_IntFree(p_00);
        aVar3 = Abc_Clock();
        uVar2 = Gia_ManDumpUntests(p,pCnf,s,nFuncVars,"newfaults.txt",pPars->fVerbose);
        printf("Dumped %d new multiple faults into file \"%s\".  ",(ulong)uVar2,"newfaults.txt");
        aVar4 = Abc_Clock();
        Abc_PrintTime(0x816bba,(char *)(aVar4 - aVar3),time);
        sat_solver_delete(s);
        Cnf_DataFree(pCnf);
        Gia_ManStop(p);
        return 1;
      }
      p_00->nSize = 0;
      iVar6 = iVar1;
      i = iVar8;
      while (bVar9 = iVar6 != 0, iVar6 = iVar6 + -1, bVar9) {
        Entry = Vec_IntEntry(vTests,i);
        Vec_IntPush(p_00,Entry);
        i = i + 1;
      }
      iVar6 = Gia_ManFaultAddOne(pM,pCnf,s,p_00,nFuncVars,0,p);
      iVar7 = iVar7 + 1;
      iVar8 = iVar8 + nFuncVars;
    } while (iVar6 != 0);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                  ,0x53c,
                  "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
                 );
  }
  __assert_fail("Vec_IntSize(vTests) % nFuncVars == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcFault.c"
                ,0x530,
                "int Gia_ManFaultDumpNewFaults(Gia_Man_t *, int, Vec_Int_t *, Vec_Int_t *, Bmc_ParFf_t *)"
               );
}

Assistant:

int Gia_ManFaultDumpNewFaults( Gia_Man_t * pM, int nFuncVars, Vec_Int_t * vTests, Vec_Int_t * vTestNew, Bmc_ParFf_t * pPars )
{
    char * pFileName = "newfaults.txt";
    abctime clk;
    Gia_Man_t * pC;
    Cnf_Dat_t * pCnf2;
    sat_solver * pSat;
    Vec_Int_t * vLits;
    int i, Iter, IterMax, nNewFaults;

    // derive the cofactor
    pC = Gia_ManFaultCofactor( pM, vTestNew );
    // derive new CNF
    pCnf2 = Cnf_DeriveGiaRemapped( pC );

    // create SAT solver
    pSat = sat_solver_new();
    sat_solver_setnvars( pSat, 1 );
    sat_solver_set_runtime_limit( pSat, pPars->nTimeOut ? pPars->nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0 );
    // create the first cofactor
    Gia_ManFaultAddOne( pM, NULL, pSat, vTestNew, nFuncVars, 1, NULL );

    // add other test patterns
    assert( Vec_IntSize(vTests) % nFuncVars == 0 );
    IterMax = Vec_IntSize(vTests) / nFuncVars;
    vLits = Vec_IntAlloc( nFuncVars );
    for ( Iter = 0; Iter < IterMax; Iter++ )
    {
        // get pattern
        Vec_IntClear( vLits );
        for ( i = 0; i < nFuncVars; i++ )
            Vec_IntPush( vLits, Vec_IntEntry(vTests, Iter*nFuncVars + i) );
        // the resulting problem cannot be UNSAT, because the new test is guaranteed 
        // to detect something that the given test set does not detect
        if ( !Gia_ManFaultAddOne( pM, pCnf2, pSat, vLits, nFuncVars, 0, pC ) )
            assert( 0 );
    }
    Vec_IntFree( vLits );

    // dump the new faults
    clk = Abc_Clock();
    nNewFaults = Gia_ManDumpUntests( pC, pCnf2, pSat, nFuncVars, pFileName, pPars->fVerbose );
    printf( "Dumped %d new multiple faults into file \"%s\".  ", nNewFaults, pFileName );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf2 );
    Gia_ManStop( pC );
    return 1;
}